

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.h
# Opt level: O1

void emitter_dict_begin(emitter_t *emitter,char *json_key,char *table_header)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (emitter->output == emitter_output_table) {
    if (0 < emitter->nesting_depth) {
      iVar3 = emitter->nesting_depth * 2;
      iVar1 = 1;
      if (1 < iVar3) {
        iVar1 = iVar3;
      }
      do {
        emitter_printf(emitter,"%s"," ");
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    emitter_printf(emitter,"%s\n",table_header);
  }
  else {
    if (emitter->output != emitter_output_json) {
      return;
    }
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      pcVar2 = "";
      if (emitter->item_at_depth != false) {
        pcVar2 = ",";
      }
      emitter_printf(emitter,"%s\n",pcVar2);
      pcVar2 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar1) {
          iVar3 = iVar1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    emitter_printf(emitter,"\"%s\": ",json_key);
    emitter->emitted_key = true;
    if (emitter->output != emitter_output_json) {
      return;
    }
    if (emitter->emitted_key == true) {
      emitter->emitted_key = false;
    }
    else {
      pcVar2 = "";
      if (emitter->item_at_depth != false) {
        pcVar2 = ",";
      }
      emitter_printf(emitter,"%s\n",pcVar2);
      pcVar2 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar2 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar1 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar3 = 1;
        if (1 < iVar1) {
          iVar3 = iVar1;
        }
        do {
          emitter_printf(emitter,"%s",pcVar2);
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    emitter_printf(emitter,"{");
  }
  emitter->nesting_depth = emitter->nesting_depth + 1;
  emitter->item_at_depth = false;
  return;
}

Assistant:

static inline void
emitter_dict_begin(emitter_t *emitter, const char *json_key,
    const char *table_header) {
	if (emitter->output == emitter_output_json) {
		emitter_json_key(emitter, json_key);
		emitter_json_object_begin(emitter);
	} else {
		emitter_table_dict_begin(emitter, table_header);
	}
}